

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

id_type __thiscall
Darts::Details::DawgBuilder::find_node(DawgBuilder *this,id_type node_id,id_type *hash_id)

{
  bool bVar1;
  id_type iVar2;
  ulong uVar3;
  size_t sVar4;
  uint *puVar5;
  int *in_RDX;
  long in_RDI;
  id_type unit_id;
  size_t in_stack_ffffffffffffffb8;
  AutoPool<unsigned_int> *in_stack_ffffffffffffffc0;
  DawgBuilder *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  iVar2 = hash_node(in_stack_ffffffffffffffd0,(id_type)((ulong)in_RDI >> 0x20));
  uVar3 = (ulong)iVar2;
  sVar4 = AutoPool<unsigned_int>::size((AutoPool<unsigned_int> *)(in_RDI + 0x78));
  *in_RDX = (int)(uVar3 % sVar4);
  while( true ) {
    puVar5 = AutoPool<unsigned_int>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8)
    ;
    iVar2 = *puVar5;
    if (iVar2 == 0) {
      return 0;
    }
    bVar1 = are_equal((DawgBuilder *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),
                      (id_type)(uVar3 >> 0x20),(id_type)uVar3);
    if (bVar1) break;
    in_stack_ffffffffffffffc0 = (AutoPool<unsigned_int> *)(ulong)(*in_RDX + 1);
    sVar4 = AutoPool<unsigned_int>::size((AutoPool<unsigned_int> *)(in_RDI + 0x78));
    *in_RDX = (int)((ulong)in_stack_ffffffffffffffc0 % sVar4);
  }
  return iVar2;
}

Assistant:

inline id_type DawgBuilder::find_node(id_type node_id,
    id_type *hash_id) const {
  *hash_id = hash_node(node_id) % table_.size();
  for ( ; ; *hash_id = (*hash_id + 1) % table_.size()) {
    id_type unit_id = table_[*hash_id];
    if (unit_id == 0) {
      break;
    }

    if (are_equal(node_id, unit_id)) {
      return unit_id;
    }
  }
  return 0;
}